

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void __thiscall Map::Map(Map *this,Map *map)

{
  Entity *pEVar1;
  bool bVar2;
  reference ppEVar3;
  Entity *this_00;
  Entity *entity;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Entity_*,_std::allocator<Entity_*>_> *__range1;
  Map *map_local;
  Map *this_local;
  
  this->_id = map->_id;
  this->_layout = map->_layout;
  this->_blockset = map->_blockset;
  this->_palette = map->_palette;
  this->_room_height = map->_room_height;
  this->_background_music = map->_background_music;
  this->_unknown_param_1 = map->_unknown_param_1;
  this->_unknown_param_2 = map->_unknown_param_2;
  this->_base_chest_id = map->_base_chest_id;
  this->_fall_destination = map->_fall_destination;
  this->_climb_destination = map->_climb_destination;
  std::vector<Entity_*,_std::allocator<Entity_*>_>::vector(&this->_entities);
  std::map<Map_*,_Flag,_std::less<Map_*>,_std::allocator<std::pair<Map_*const,_Flag>_>_>::map
            (&this->_variants,&map->_variants);
  this->_parent_map = map->_parent_map;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->_speaker_ids);
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::vector
            (&this->_global_entity_mask_flags,&map->_global_entity_mask_flags);
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::vector
            (&this->_key_door_mask_flags);
  Flag::Flag(&this->_visited_flag);
  this->_map_setup_addr = 0xffffffff;
  this->_map_update_addr = 0xffffffff;
  __end1 = std::vector<Entity_*,_std::allocator<Entity_*>_>::begin(&map->_entities);
  entity = (Entity *)std::vector<Entity_*,_std::allocator<Entity_*>_>::end(&map->_entities);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<Entity_*const_*,_std::vector<Entity_*,_std::allocator<Entity_*>_>_>
                      (&__end1,(__normal_iterator<Entity_*const_*,_std::vector<Entity_*,_std::allocator<Entity_*>_>_>
                                *)&entity);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppEVar3 = __gnu_cxx::
              __normal_iterator<Entity_*const_*,_std::vector<Entity_*,_std::allocator<Entity_*>_>_>
              ::operator*(&__end1);
    pEVar1 = *ppEVar3;
    this_00 = (Entity *)operator_new(0x58);
    Entity::Entity(this_00,pEVar1);
    add_entity(this,this_00);
    __gnu_cxx::__normal_iterator<Entity_*const_*,_std::vector<Entity_*,_std::allocator<Entity_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

Map::Map(const Map& map) :
    _id                         (map._id),
    _layout                     (map._layout),
    _blockset                   (map._blockset),
    _palette                    (map._palette),
    _room_height                (map._room_height),
    _background_music           (map._background_music),
    _unknown_param_1            (map._unknown_param_1),
    _unknown_param_2            (map._unknown_param_2),
    _base_chest_id              (map._base_chest_id),
    _fall_destination           (map._fall_destination),
    _climb_destination          (map._climb_destination),
    _parent_map                 (map._parent_map),
    _variants                   (map._variants),
    _global_entity_mask_flags   (map._global_entity_mask_flags)
{
    for(Entity* entity : map._entities)
        this->add_entity(new Entity(*entity));
}